

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructor.cpp
# Opt level: O0

Constructor * __thiscall cppgenerate::Constructor::operator=(Constructor *this,Constructor *other)

{
  Constructor *other_local;
  Constructor *this_local;
  
  if (this != other) {
    std::__cxx11::string::operator=((string *)this,(string *)other);
    std::__cxx11::list<cppgenerate::Argument,_std::allocator<cppgenerate::Argument>_>::clear
              (&this->m_arguments);
    std::__cxx11::list<cppgenerate::Argument,_std::allocator<cppgenerate::Argument>_>::operator=
              (&this->m_arguments,&other->m_arguments);
    CodeBlock::operator=(&this->m_code,&other->m_code);
    this->m_accessModifier = other->m_accessModifier;
  }
  return this;
}

Assistant:

Constructor& Constructor::operator=( const Constructor& other ){
    if( this != &other ){
        m_documentation = other.m_documentation;
        m_arguments.clear();
        m_arguments = other.m_arguments;
        m_code = other.m_code;
        m_accessModifier = other.m_accessModifier;
    }

    return *this;
}